

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O0

void __thiscall
Diffusion::diffuse_Vsync
          (Diffusion *this,MultiFab *Vsync,Real dt,Real be_cn_theta,MultiFab *rho_half,int rho_flag,
          MultiFab **beta,int betaComp,bool update_fluxreg)

{
  int iVar1;
  uint uVar2;
  Geometry *this_00;
  IntVect *pIVar3;
  Box *in_RDI;
  byte in_stack_00000008;
  Box bottom_strip;
  IntVect bigend;
  Box top_strip;
  IntVect smallend;
  int k;
  BCRec *velbc;
  int n;
  Box domain;
  int allthere;
  undefined1 in_stack_0000170b;
  int in_stack_0000170c;
  MultiFab **in_stack_00001710;
  int in_stack_0000171c;
  MultiFab *in_stack_00001720;
  Real in_stack_00001728;
  Real in_stack_00001730;
  MultiFab *in_stack_00001738;
  Diffusion *in_stack_00001740;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  Diffusion *in_stack_fffffffffffffe48;
  Box *in_stack_fffffffffffffe50;
  Box *in_stack_fffffffffffffe60;
  IntVect *in_stack_fffffffffffffe68;
  value_type in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined8 local_150;
  int local_148;
  int local_140 [2];
  int local_138;
  int local_130 [2];
  int local_128;
  undefined8 local_108;
  int local_100;
  int local_fc;
  BCRec *local_f8;
  int local_ec;
  undefined1 local_e8 [35];
  byte local_c5;
  undefined4 local_84;
  Box *local_80;
  int local_74;
  BCRec *local_70;
  int local_68;
  int local_64;
  undefined8 *local_60;
  int local_58;
  int local_54;
  undefined8 *local_50;
  value_type local_48;
  int local_40;
  value_type local_34;
  int local_2c;
  int local_28 [2];
  int local_20;
  IntVect local_18;
  int local_c;
  BCRec *local_8;
  
  local_c5 = in_stack_00000008 & 1;
  checkBeta(in_stack_fffffffffffffe48,
            (MultiFab **)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
            (int *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  uVar2 = (uint)(local_c5 & 1);
  diffuse_tensor_Vsync
            (in_stack_00001740,in_stack_00001738,in_stack_00001730,in_stack_00001728,
             in_stack_00001720,in_stack_0000171c,in_stack_00001710,in_stack_0000170c,
             (bool)in_stack_0000170b);
  this_00 = amrex::AmrLevel::Geom(*(AmrLevel **)((in_RDI->smallend).vect + 2));
  local_80 = amrex::Geometry::Domain(this_00);
  local_84 = 1;
  local_e8._0_8_ = *(undefined8 *)(local_80->smallend).vect;
  local_e8._8_8_ = *(undefined8 *)((local_80->smallend).vect + 2);
  local_e8._16_8_ = *(undefined8 *)((local_80->bigend).vect + 1);
  local_e8._24_4_ = (local_80->btype).itype;
  amrex::Box::grow((Box *)local_e8,1);
  for (local_ec = 0; local_ec < 3; local_ec = local_ec + 1) {
    amrex::AmrLevel::get_desc_lst();
    amrex::DescriptorList::operator[]
              ((DescriptorList *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe3c);
    local_f8 = amrex::StateDescriptor::getBC
                         ((StateDescriptor *)
                          CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                          in_stack_fffffffffffffe3c);
    for (local_fc = 0; local_fc < 3; local_fc = local_fc + 1) {
      local_70 = local_f8;
      local_74 = local_fc;
      if (local_f8->bc[local_fc + 3] == 3) {
        in_stack_fffffffffffffe60 = (Box *)local_e8;
        pIVar3 = amrex::Box::smallEnd(in_stack_fffffffffffffe60);
        iVar1 = local_fc;
        local_100 = pIVar3->vect[2];
        local_108 = *(undefined8 *)pIVar3->vect;
        local_58 = amrex::Box::bigEnd(in_stack_fffffffffffffe60,local_fc);
        local_50 = &local_108;
        local_54 = iVar1;
        *(int *)((long)local_50 + (long)iVar1 * 4) = local_58;
        in_stack_fffffffffffffe68 = amrex::Box::bigEnd(in_stack_fffffffffffffe60);
        amrex::IntVect::IntVect(&local_18,0);
        local_20 = local_18.vect[2];
        local_28[0] = local_18.vect[0];
        local_28[1] = local_18.vect[1];
        local_138 = local_18.vect[2];
        local_140[0] = local_18.vect[0];
        local_140[1] = local_18.vect[1];
        local_130[0] = local_18.vect[0];
        local_130[1] = local_18.vect[1];
        local_128 = local_18.vect[2];
        amrex::Box::Box(in_stack_fffffffffffffe50,(IntVect *)in_stack_fffffffffffffe48,
                        (IntVect *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                        (IntVect *)CONCAT44(in_stack_fffffffffffffe3c,uVar2));
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe78,in_RDI,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                   (int)in_stack_fffffffffffffe68,(int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
      }
      local_8 = local_f8;
      local_c = local_fc;
      if (local_f8->bc[local_fc] == 3) {
        in_stack_fffffffffffffe48 = (Diffusion *)local_e8;
        pIVar3 = amrex::Box::bigEnd((Box *)in_stack_fffffffffffffe48);
        local_148 = pIVar3->vect[2];
        local_150 = *(undefined8 *)pIVar3->vect;
        in_stack_fffffffffffffe44 = local_fc;
        local_68 = amrex::Box::smallEnd((Box *)in_stack_fffffffffffffe48,local_fc);
        local_60 = &local_150;
        *(int *)((long)local_60 + (long)in_stack_fffffffffffffe44 * 4) = local_68;
        local_64 = in_stack_fffffffffffffe44;
        in_stack_fffffffffffffe50 = (Box *)amrex::Box::smallEnd((Box *)in_stack_fffffffffffffe48);
        amrex::IntVect::IntVect((IntVect *)&local_34,0);
        local_40 = local_2c;
        local_48 = local_34;
        in_stack_fffffffffffffe78 = local_34;
        in_stack_fffffffffffffe80 = local_2c;
        amrex::Box::Box(in_stack_fffffffffffffe50,(IntVect *)in_stack_fffffffffffffe48,
                        (IntVect *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                        (IntVect *)CONCAT44(in_stack_fffffffffffffe3c,uVar2));
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe78,in_RDI,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                   (int)in_stack_fffffffffffffe68,(int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
      }
    }
  }
  return;
}

Assistant:

void
Diffusion::diffuse_Vsync (MultiFab&              Vsync,
                          Real                   dt,
                          Real                   be_cn_theta,
                          const MultiFab&        rho_half,
                          int                    rho_flag,
                          const MultiFab* const* beta,
                          int                    betaComp,
                          bool                   update_fluxreg)
{
    BL_ASSERT(rho_flag == 1|| rho_flag == 3);

    int allthere;
    checkBeta(beta, allthere);

#ifdef AMREX_DEBUG
    for (int d = 0; d < AMREX_SPACEDIM; ++d)
        BL_ASSERT(beta[d]->min(0,0) >= 0.0);
#endif

    diffuse_tensor_Vsync(Vsync,dt,be_cn_theta,rho_half,rho_flag,beta,betaComp,update_fluxreg);
    //
    // applyBC has put "incorrect" values in the ghost cells
    // outside external Dirichlet boundaries. Reset these to zero
    // so that syncproject and conservative interpolation works correctly.
    //
    Box domain = amrex::grow(navier_stokes->Geom().Domain(),1);

    for (int n = Xvel; n < Xvel+AMREX_SPACEDIM; n++)
    {
        const BCRec& velbc = navier_stokes->get_desc_lst()[State_Type].getBC(n);

        for (int k = 0; k < AMREX_SPACEDIM; k++)
        {
            if (velbc.hi(k) == EXT_DIR)
            {
                IntVect smallend = domain.smallEnd();
                smallend.setVal(k,domain.bigEnd(k));
                Box top_strip(smallend,domain.bigEnd(),IntVect::TheCellVector());
                Vsync.setVal(0,top_strip,n-Xvel,1,1);
            }
            if (velbc.lo(k) == EXT_DIR)
            {
                IntVect bigend = domain.bigEnd();
                bigend.setVal(k,domain.smallEnd(k));
                Box bottom_strip(domain.smallEnd(),bigend,IntVect::TheCellVector());
                Vsync.setVal(0,bottom_strip,n-Xvel,1,1);
            }
        }
    }
}